

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

_Bool fnet_socket_recvfrom
                (fnet_socket_t sock,char *buf,size_t len,size_t *read_len,fnet_address_t *addr)

{
  ssize_t sVar1;
  long *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  int in_EDI;
  sockaddr *in_R8;
  int res;
  socklen_t sockaddr_len;
  socklen_t local_2c [3];
  long *local_20;
  _Bool local_1;
  
  if ((in_RCX == (long *)0x0) || (in_RSI == (void *)0x0)) {
    local_1 = false;
  }
  else {
    *in_RCX = 0;
    local_2c[0] = 0x80;
    local_20 = in_RCX;
    sVar1 = recvfrom(in_EDI,in_RSI,in_RDX,0,in_R8,local_2c);
    if ((int)sVar1 == -1) {
      local_1 = false;
    }
    else {
      *local_20 = (long)(int)sVar1;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool fnet_socket_recvfrom(fnet_socket_t sock, char *buf, size_t len, size_t *read_len, fnet_address_t *addr)
{
    if (!read_len || !buf)
    {
        FLOG_ERR("Invalid arguments");
        return false;
    }

    *read_len = 0;
    socklen_t sockaddr_len = sizeof *addr;

    int res = recvfrom(sock, buf, len, 0, (struct sockaddr *)addr, &sockaddr_len);
    switch(res)
    {
        case -1:
        {
            FLOG_ERR("Unable to recv data");
            return false;
        }

        default:
            break;
    }

    *read_len = res;

    return true;
}